

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.h
# Opt level: O2

void __thiscall imrt::Station::~Station(Station *this)

{
  this->_vptr_Station = (_func_int **)&PTR__Station_0012cd60;
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&(this->int2nb)._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::pair<int,_int>_>,_std::_Select1st<std::pair<const_int,_std::pair<int,_int>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
  ::~_Rb_tree(&(this->beam2pos)._M_t);
  std::
  _Rb_tree<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_int>,_std::_Select1st<std::pair<const_std::pair<int,_int>,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
  ::~_Rb_tree(&(this->pos2beam)._M_t);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->intensity).super__Vector_base<double,_std::allocator<double>_>);
  maths::Matrix::~Matrix(&this->I);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->last_intensity).super__Vector_base<double,_std::allocator<double>_>);
  std::__cxx11::_List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
  _M_clear(&(this->last_diff).
            super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>);
  std::
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ::~vector(&this->A);
  std::
  _Rb_tree<int,_std::pair<const_int,_const_maths::Matrix_*>,_std::_Select1st<std::pair<const_int,_const_maths::Matrix_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_maths::Matrix_*>_>_>
  ::~_Rb_tree(&(this->D)._M_t);
  return;
}

Assistant:

virtual ~Station(){ }